

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_heter_queue.h
# Opt level: O2

put_transaction<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::Data>
* __thiscall
density::
sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
::
start_emplace<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>>::Data>
          (put_transaction<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::Data>
           *__return_storage_ptr__,
          sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
          *this)

{
  Allocation push_data;
  Allocation local_50;
  put_transaction<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::Data>
  local_38;
  
  detail::
  SpQueue_TailMultiple<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,density::default_busy_wait>
  ::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)0,1ul,true,24ul,8ul>
            (&local_50,this);
  local_50.m_control_block[1].m_next =
       (uintptr_t)
       detail::
       FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density_tests::detail::PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>>::Data>
       ::s_table;
  (((vector<char_*,_std::allocator<char_*>_> *)local_50.m_user_storage)->
  super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (((vector<char_*,_std::allocator<char_*>_> *)local_50.m_user_storage)->
  super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (((vector<char_*,_std::allocator<char_*>_> *)local_50.m_user_storage)->
  super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  density_tests::detail::
  PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>
  ::Data::Data((Data *)local_50.m_user_storage);
  local_38.m_put.m_control_block = local_50.m_control_block;
  local_38.m_put.m_next_ptr = local_50.m_next_ptr;
  (__return_storage_ptr__->m_put).m_user_storage = local_50.m_user_storage;
  (__return_storage_ptr__->m_put).m_control_block = local_50.m_control_block;
  (__return_storage_ptr__->m_put).m_next_ptr = local_50.m_next_ptr;
  __return_storage_ptr__->m_queue =
       (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
        *)this;
  local_38.m_put.m_user_storage = (void *)0x0;
  local_38.m_queue =
       (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
        *)this;
  sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::
  put_transaction<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::Data>
  ::~put_transaction(&local_38);
  return __return_storage_ptr__;
}

Assistant:

put_transaction<ELEMENT_TYPE> start_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            auto push_data = Base::template try_inplace_allocate_impl<
              detail::LfQueue_Throwing,
              detail::LfQueue_Busy,
              true,
              detail::size_of<ELEMENT_TYPE>::value,
              alignof(ELEMENT_TYPE)>();

            runtime_type * type = nullptr;
            try
            {
                auto const type_storage = Base::type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) runtime_type(runtime_type::template make<ELEMENT_TYPE>());

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                new (push_data.m_user_storage)
                  ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            }
            catch (...)
            {
                if (type != nullptr)
                    type->RUNTIME_TYPE::~RUNTIME_TYPE();

                Base::cancel_put_nodestroy_impl(push_data);
                throw;
            }

            return put_transaction<ELEMENT_TYPE>(PrivateType(), this, push_data);
        }